

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RU_matrix.h
# Opt level: O1

void Gudhi::persistence_matrix::swap
               (RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_false,_false>_>_>
                *matrix1,
               RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_false,_false>_>_>
               *matrix2)

{
  Pos_index PVar1;
  pointer puVar2;
  Field_operators *pFVar3;
  pointer puVar4;
  pointer puVar5;
  
  swap(&matrix1->super_RU_representative_cycles_option,
       &matrix2->super_RU_representative_cycles_option);
  swap(&matrix1->reducedMatrixR_,&matrix2->reducedMatrixR_);
  swap(&matrix1->mirrorMatrixU_,&matrix2->mirrorMatrixU_);
  puVar4 = (matrix1->pivotToColumnIndex_).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar5 = (matrix1->pivotToColumnIndex_).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar2 = (matrix1->pivotToColumnIndex_).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (matrix1->pivotToColumnIndex_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (matrix2->pivotToColumnIndex_).
       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  (matrix1->pivotToColumnIndex_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (matrix2->pivotToColumnIndex_).
       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (matrix1->pivotToColumnIndex_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (matrix2->pivotToColumnIndex_).
       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (matrix2->pivotToColumnIndex_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = puVar4;
  (matrix2->pivotToColumnIndex_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = puVar5;
  (matrix2->pivotToColumnIndex_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = puVar2;
  PVar1 = matrix1->nextEventIndex_;
  matrix1->nextEventIndex_ = matrix2->nextEventIndex_;
  matrix2->nextEventIndex_ = PVar1;
  pFVar3 = matrix1->operators_;
  matrix1->operators_ = matrix2->operators_;
  matrix2->operators_ = pFVar3;
  return;
}

Assistant:

void swap(RU_matrix& matrix1, RU_matrix& matrix2) {
    swap(static_cast<typename Master_matrix::RU_pairing_option&>(matrix1),
         static_cast<typename Master_matrix::RU_pairing_option&>(matrix2));
    swap(static_cast<typename Master_matrix::RU_vine_swap_option&>(matrix1),
         static_cast<typename Master_matrix::RU_vine_swap_option&>(matrix2));
    swap(static_cast<typename Master_matrix::RU_representative_cycles_option&>(matrix1),
         static_cast<typename Master_matrix::RU_representative_cycles_option&>(matrix2));
    swap(matrix1.reducedMatrixR_, matrix2.reducedMatrixR_);
    swap(matrix1.mirrorMatrixU_, matrix2.mirrorMatrixU_);
    matrix1.pivotToColumnIndex_.swap(matrix2.pivotToColumnIndex_);
    std::swap(matrix1.nextEventIndex_, matrix2.nextEventIndex_);
    std::swap(matrix1.operators_, matrix2.operators_);
  }